

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCovDerive(Cov_Man_t *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_34;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  Cov_Man_t *p_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    p_local = (Cov_Man_t *)Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    for (local_34 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_34 < iVar1; local_34 = local_34 + 1) {
      pAVar2 = Abc_NtkCo(pNtk,local_34);
      pAVar2 = Abc_ObjFanin0(pAVar2);
      Abc_NtkCovDeriveNode_rec(p,(Abc_Ntk_t *)p_local,pAVar2,0);
    }
    Abc_NtkFinalize(pNtk,(Abc_Ntk_t *)p_local);
    Abc_NtkLogicMakeSimpleCos((Abc_Ntk_t *)p_local,1);
    iVar1 = Abc_NtkCheck((Abc_Ntk_t *)p_local);
    if (iVar1 == 0) {
      printf("Abc_NtkCovDerive: The network check has failed.\n");
      Abc_NtkDelete((Abc_Ntk_t *)p_local);
      p_local = (Cov_Man_t *)0x0;
    }
    return (Abc_Ntk_t *)p_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/cov/covBuild.c"
                ,0xbc,"Abc_Ntk_t *Abc_NtkCovDerive(Cov_Man_t *, Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkCovDerive( Cov_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // reconstruct the network
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_NtkCovDeriveNode_rec( p, pNtkNew, Abc_ObjFanin0(pObj), 0 );
//        printf( "*** CO %s : %d -> %d \n", Abc_ObjName(pObj), pObj->pCopy->Id, Abc_ObjFanin0(pObj)->pCopy->Id );
    }
    // add the COs
    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 1 );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCovDerive: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}